

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write_double<long_double>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,longdouble value,format_specs *spec)

{
  alignment aVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined3 uVar4;
  char *pcVar5;
  type pcVar6;
  char cVar7;
  char *str;
  size_t size;
  float_spec_handler<char> handler;
  align_spec as;
  short sStack_290;
  write_inf_or_nan_t write_inf_or_nan;
  format_specs normalized_spec;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  
  sStack_290 = (short)((unkuint10)value >> 0x40);
  handler.type = spec->type_;
  handler.upper = false;
  internal::handle_float_type_spec<char,fmt::v5::float_spec_handler<char>&>(handler.type,&handler);
  if (sStack_290 < 0) {
    value = -value;
    cVar7 = '-';
  }
  else if ((spec->flags_ & 1) == 0) {
    cVar7 = '\0';
  }
  else {
    cVar7 = '+';
    if ((spec->flags_ & 2) == 0) {
      cVar7 = ' ';
    }
  }
  write_inf_or_nan.spec.super_align_spec.width_ = (spec->super_align_spec).width_;
  write_inf_or_nan.spec.super_align_spec.fill_ = (spec->super_align_spec).fill_;
  write_inf_or_nan.spec._8_5_ = SUB85(*(undefined8 *)&(spec->super_align_spec).align_,0);
  uVar3 = *(undefined8 *)((long)&spec->flags_ + 1);
  write_inf_or_nan.spec.flags_._1_3_ = (undefined3)uVar3;
  write_inf_or_nan.spec._16_5_ = SUB85((ulong)uVar3 >> 0x18,0);
  write_inf_or_nan.writer = this;
  write_inf_or_nan.sign = cVar7;
  if (NAN(value)) {
    pcVar5 = "NAN";
    str = "nan";
LAB_0013e63c:
    if (handler.upper != false) {
      str = pcVar5;
    }
    write_double<long_double>::write_inf_or_nan_t::operator()(&write_inf_or_nan,str);
    return;
  }
  if ((longdouble)INFINITY <= value) {
    pcVar5 = "INF";
    str = "inf";
    goto LAB_0013e63c;
  }
  buffer.super_basic_buffer<char>.ptr_ = buffer.store_;
  buffer.super_basic_buffer<char>.size_ = 0;
  buffer.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_0014eba0;
  buffer.super_basic_buffer<char>.capacity_ = 500;
  uVar2 = spec->precision_;
  uVar4 = *(undefined3 *)&spec->field_0x15;
  normalized_spec.super_align_spec.width_ = (spec->super_align_spec).width_;
  normalized_spec.super_align_spec.fill_ = (spec->super_align_spec).fill_;
  normalized_spec._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  normalized_spec.type_ = handler.type;
  normalized_spec.precision_ = uVar2;
  normalized_spec._21_3_ = uVar4;
  write_double_sprintf<long_double>(this,value,&normalized_spec,&buffer.super_basic_buffer<char>);
  size = buffer.super_basic_buffer<char>.size_;
  as.align_ = (spec->super_align_spec).align_;
  as.width_ = (spec->super_align_spec).width_;
  as.fill_ = (spec->super_align_spec).fill_;
  aVar1 = (spec->super_align_spec).align_;
  if (aVar1 == ALIGN_DEFAULT) {
    as.align_ = ALIGN_RIGHT;
  }
  else if (aVar1 == ALIGN_NUMERIC) {
    if (cVar7 != '\0') {
      pcVar6 = internal::reserve<fmt::v5::internal::basic_buffer<char>>(&this->out_,1);
      *pcVar6 = cVar7;
      if (as.width_ != 0) {
        as.width_ = as.width_ - 1;
      }
    }
    as.align_ = ALIGN_RIGHT;
    cVar7 = '\0';
    goto LAB_0013e70b;
  }
  size = (buffer.super_basic_buffer<char>.size_ + 1) - (ulong)(cVar7 == '\0');
LAB_0013e70b:
  normalized_spec.super_align_spec.align_._0_1_ = cVar7;
  normalized_spec.super_align_spec._0_8_ = size;
  normalized_spec._16_8_ = &buffer;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
  ::
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::double_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              *)this,size,&as,(double_writer *)&normalized_spec);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buffer);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler<char_type> handler(spec.type());
  internal::handle_float_type_spec(spec.type(), handler);

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::fputil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(INF_SIZE + (sign ? 1 : 0), spec,
                          inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  basic_memory_buffer<char_type> buffer;
  char type = static_cast<char>(spec.type());
  if (internal::const_check(
        internal::use_grisu() && sizeof(T) <= sizeof(double)) &&
      type != 'a' && type != 'A') {
    char buf[100]; // TODO: correct buffer size
    size_t size = 0;
    internal::grisu2_format(static_cast<double>(value), buf, size, type,
                            spec.precision(), spec.flag(HASH_FLAG));
    FMT_ASSERT(size <= 100, "buffer overflow");
    buffer.append(buf, buf + size); // TODO: avoid extra copy
  } else {
    format_specs normalized_spec(spec);
    normalized_spec.type_ = handler.type;
    write_double_sprintf(value, normalized_spec, buffer);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = sign;
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(n, as, double_writer{n, sign, buffer});
}